

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTopologyRepresentation::~IfcTopologyRepresentation
          (IfcTopologyRepresentation *this)

{
  pointer pLVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  (this->super_IfcShapeModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x8a3eb0;
  *(undefined8 *)&(this->super_IfcShapeModel).field_0xa0 = 0x8a3ed8;
  pLVar1 = (this->super_IfcShapeModel).super_IfcRepresentation.Items.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  pcVar2 = (this->super_IfcShapeModel).super_IfcRepresentation.RepresentationType.ptr._M_dataplus.
           _M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 !=
      &(this->super_IfcShapeModel).super_IfcRepresentation.RepresentationType.ptr.field_2) {
    operator_delete(pcVar2);
  }
  puVar3 = *(undefined1 **)
            &(this->super_IfcShapeModel).super_IfcRepresentation.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x18;
  if (puVar3 != &(this->super_IfcShapeModel).super_IfcRepresentation.field_0x28) {
    operator_delete(puVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcTopologyRepresentation() : Object("IfcTopologyRepresentation") {}